

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_ComparatorsAndCopiersRepository_InstallComparatorsAndCopiersFromRepository_TestShell::
createTest(TEST_ComparatorsAndCopiersRepository_InstallComparatorsAndCopiersFromRepository_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockNamedValueTest.cpp"
                                  ,0x4d);
  TEST_ComparatorsAndCopiersRepository_InstallComparatorsAndCopiersFromRepository_Test::
  TEST_ComparatorsAndCopiersRepository_InstallComparatorsAndCopiersFromRepository_Test
            ((TEST_ComparatorsAndCopiersRepository_InstallComparatorsAndCopiersFromRepository_Test *
             )this_00);
  return this_00;
}

Assistant:

TEST(ComparatorsAndCopiersRepository, InstallComparatorsAndCopiersFromRepository)
{
  MyComparator comparator;
  MyCopier copier;
  MockNamedValueComparatorsAndCopiersRepository source;
  MockNamedValueComparatorsAndCopiersRepository target;

  source.installCopier("MyType", copier);
  source.installComparator("MyType", comparator);

  target.installComparatorsAndCopiers(source);

  POINTERS_EQUAL(&comparator, target.getComparatorForType("MyType"));
  POINTERS_EQUAL(&copier, target.getCopierForType("MyType"));

  source.clear();
  target.clear();
}